

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

size_t __thiscall nuraft::raft_server::get_not_responding_peers(raft_server *this)

{
  _Hash_node_base *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Hash_node_base *p_Var3;
  uint64_t uVar4;
  int iVar5;
  _Hash_node_base *p_Var6;
  size_t sVar7;
  ptr<raft_params> params;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  context::get_params((context *)&stack0xffffffffffffffc0);
  p_Var6 = (this->peers_)._M_h._M_before_begin._M_nxt;
  if (p_Var6 == (_Hash_node_base *)0x0) {
    sVar7 = 0;
  }
  else {
    iVar5 = DAT_00638a08 * *(int *)&local_40[1]._vptr_state_mgr;
    sVar7 = 0;
    do {
      p_Var1 = p_Var6[2]._M_nxt;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6[3]._M_nxt;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      peVar2 = (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var3 = p_Var1->_M_nxt;
      if (((peVar2 == (element_type *)0x0) ||
          (((peVar2->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->id_ != *(int *)&p_Var3->_M_nxt)) && (*(char *)&p_Var3[9]._M_nxt == '\0')) {
        uVar4 = timer_helper::get_us((timer_helper *)(p_Var1 + 0x28));
        sVar7 = sVar7 + (iVar5 < (int)(uVar4 / 1000));
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  return sVar7;
}

Assistant:

size_t raft_server::get_not_responding_peers() {
    // Check if quorum nodes are not responding
    // (i.e., don't respond 20x heartbeat time long).
    size_t num_not_resp_nodes = 0;

    ptr<raft_params> params = ctx_->get_params();
    int expiry = params->heart_beat_interval_ *
                     raft_server::raft_limits_.response_limit_;

    // Check the number of not responding peers.
    for (auto& entry: peers_) {
        ptr<peer> p = entry.second;

        if (!is_regular_member(p)) continue;

        int32 resp_elapsed_ms = (int32)(p->get_resp_timer_us() / 1000);
        if ( resp_elapsed_ms > expiry ) {
            num_not_resp_nodes++;
        }
    }
    return num_not_resp_nodes;
}